

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall cmExtraCodeBlocksGenerator::Generate(cmExtraCodeBlocksGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  _Base_ptr p_Var2;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var2 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var2 + 2));
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::Generate()
{
  // for each sub project in the project create a codeblocks project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    // create a project file
    this->CreateProjectFile(it->second);
    }
}